

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

Integer pnga_inquire_memory(void)

{
  Integer sum;
  Integer i;
  
  sum = 0;
  for (i = 0; i < _max_global_array; i = i + 1) {
    if (GA[i].actv != 0) {
      sum = GA[i].size + sum;
    }
  }
  return sum;
}

Assistant:

Integer pnga_inquire_memory()
{
Integer i, sum=0;
    for(i=0; i<_max_global_array; i++) 
        if(GA[i].actv) sum += (Integer)GA[i].size; 
    return(sum);
}